

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpivotL.c
# Opt level: O1

int cpivotL(int jcol,double u,int *usepr,int *perm_r,int *iperm_r,int *iperm_c,int *pivrow,
           GlobalLU_t *Glu,SuperLUStat_t *stat)

{
  int_t iVar1;
  void *pvVar2;
  int_t *piVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  undefined4 in_register_0000003c;
  singlecomplex *z;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  float fVar19;
  singlecomplex temp;
  singlecomplex one;
  singlecomplex local_90;
  undefined8 local_88;
  long local_80;
  int *local_78;
  int local_6c;
  long local_68;
  long local_60;
  double local_58;
  int *local_50;
  ulong local_48;
  flops_t *local_40;
  singlecomplex local_38;
  
  local_88 = CONCAT44(in_register_0000003c,jcol);
  local_38.r = 1.0;
  local_38.i = 0.0;
  local_40 = stat->ops;
  pvVar2 = Glu->lusup;
  local_60 = (long)Glu->xsup[Glu->supno[jcol]];
  iVar6 = Glu->xlsub[local_60];
  iVar11 = Glu->xlsub[local_60 + 1] - iVar6;
  local_68 = (long)Glu->xlusup[local_60];
  local_80 = (long)Glu->xlusup[jcol];
  piVar3 = Glu->lsub;
  uVar8 = jcol - Glu->xsup[Glu->supno[jcol]];
  if (*usepr != 0) {
    *pivrow = iperm_r[jcol];
  }
  uVar13 = 0xffffffff;
  uVar9 = 0xffffffff;
  fVar19 = 0.0;
  local_48 = (ulong)(iVar11 - uVar8);
  uVar14 = uVar8;
  uVar10 = uVar8;
  local_78 = pivrow;
  local_58 = u;
  local_50 = perm_r;
  if (iVar11 - uVar8 != 0 && (int)uVar8 <= iVar11) {
    local_6c = iperm_c[jcol];
    uVar12 = (ulong)(int)uVar8;
    z = (singlecomplex *)(uVar12 * 8 + local_80 * 8 + (long)pvVar2);
    fVar19 = 0.0;
    do {
      dVar17 = c_abs1(z);
      fVar16 = (float)dVar17;
      if (fVar19 < fVar16) {
        uVar10 = (uint)uVar12;
      }
      if ((*usepr != 0) && (piVar3[(long)iVar6 + uVar12] == *local_78)) {
        uVar14 = (uint)uVar12;
      }
      if (fVar16 <= fVar19) {
        fVar16 = fVar19;
      }
      fVar19 = fVar16;
      if (piVar3[(long)iVar6 + uVar12] == local_6c) {
        uVar13 = uVar12 & 0xffffffff;
      }
      uVar9 = (uint)uVar13;
      uVar12 = uVar12 + 1;
      z = z + 1;
    } while ((long)uVar12 < (long)iVar11);
  }
  lVar4 = local_80;
  if ((fVar19 != 0.0) || (NAN(fVar19))) {
    dVar17 = (double)fVar19 * local_58;
    uVar15 = uVar10;
    if (*usepr != 0) {
      dVar18 = c_abs1((singlecomplex *)((long)pvVar2 + (long)(int)uVar14 * 8 + local_80 * 8));
      fVar19 = (float)dVar18;
      if (((fVar19 == 0.0) && (!NAN(fVar19))) || (uVar15 = uVar14, fVar19 < (float)dVar17)) {
        *usepr = 0;
        uVar15 = uVar10;
      }
    }
    uVar5 = local_88;
    if (*usepr == 0) {
      if (-1 < (int)uVar9) {
        dVar18 = c_abs1((singlecomplex *)((long)pvVar2 + (ulong)uVar9 * 8 + lVar4 * 8));
        fVar19 = (float)dVar18;
        if (fVar19 < (float)dVar17) {
          uVar9 = uVar15;
        }
        if (fVar19 != 0.0) {
          uVar15 = uVar9;
        }
        if (NAN(fVar19)) {
          uVar15 = uVar9;
        }
      }
      *local_78 = piVar3[(long)iVar6 + (long)(int)uVar15];
    }
    local_50[*local_78] = (int)uVar5;
    lVar7 = (long)(int)uVar8;
    if (uVar15 != uVar8) {
      iVar1 = piVar3[(long)iVar6 + (long)(int)uVar15];
      piVar3[(long)iVar6 + (long)(int)uVar15] = piVar3[iVar6 + lVar7];
      piVar3[iVar6 + lVar7] = iVar1;
      if (-1 < (int)uVar8) {
        uVar13 = (ulong)(((int)uVar5 - (int)local_60) + 1);
        uVar9 = uVar8;
        do {
          local_90 = *(singlecomplex *)((long)pvVar2 + (long)(int)uVar15 * 8 + local_68 * 8);
          *(undefined8 *)((long)pvVar2 + (long)(int)uVar15 * 8 + local_68 * 8) =
               *(undefined8 *)((long)pvVar2 + (long)(int)uVar9 * 8 + local_68 * 8);
          *(singlecomplex *)((long)pvVar2 + (long)(int)uVar9 * 8 + local_68 * 8) = local_90;
          uVar9 = uVar9 + iVar11;
          uVar15 = uVar15 + iVar11;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
    }
    local_40[7] = (float)((int)local_48 * 10) + local_40[7];
    c_div(&local_90,&local_38,(singlecomplex *)((long)pvVar2 + lVar7 * 8 + lVar4 * 8));
    iVar6 = 0;
    if ((int)(uVar8 + 1) < iVar11) {
      lVar7 = (long)(int)(uVar8 + 1);
      lVar4 = local_80 * 8 + 4;
      do {
        fVar19 = *(float *)((long)pvVar2 + lVar7 * 8 + local_80 * 8);
        fVar16 = *(float *)((long)pvVar2 + lVar7 * 8 + lVar4);
        *(float *)((long)pvVar2 + lVar7 * 8 + local_80 * 8) =
             fVar19 * local_90.r - local_90.i * fVar16;
        *(float *)((long)pvVar2 + lVar7 * 8 + lVar4) = fVar16 * local_90.r + fVar19 * local_90.i;
        lVar7 = lVar7 + 1;
      } while (lVar7 < iVar11);
    }
  }
  else {
    *usepr = 0;
    iVar6 = (int)local_88 + 1;
  }
  return iVar6;
}

Assistant:

int
cpivotL(
        const int  jcol,     /* in */
        const double u,      /* in - diagonal pivoting threshold */
        int        *usepr,   /* re-use the pivot sequence given by perm_r/iperm_r */
        int        *perm_r,  /* may be modified */
        int        *iperm_r, /* in - inverse of perm_r */
        int        *iperm_c, /* in - used to find diagonal of Pc*A*Pc' */
        int        *pivrow,  /* out */
        GlobalLU_t *Glu,     /* modified - global LU data structures */
	SuperLUStat_t *stat  /* output */
       )
{

    singlecomplex one = {1.0, 0.0};
    int          fsupc;	    /* first column in the supernode */
    int          nsupc;	    /* no of columns in the supernode */
    int          nsupr;     /* no of rows in the supernode */
    int_t        lptr;	    /* points to the starting subscript of the supernode */
    int          pivptr, old_pivptr, diag, diagind;
    float       pivmax, rtemp, thresh;
    singlecomplex       temp;
    singlecomplex       *lu_sup_ptr; 
    singlecomplex       *lu_col_ptr;
    int_t        *lsub_ptr;
    int_t        isub, icol, k, itemp;
    int_t        *lsub, *xlsub;
    singlecomplex       *lusup;
    int_t        *xlusup;
    flops_t      *ops = stat->ops;

    /* Initialize pointers */
    lsub       = Glu->lsub;
    xlsub      = Glu->xlsub;
    lusup      = (singlecomplex *) Glu->lusup;
    xlusup     = Glu->xlusup;
    fsupc      = (Glu->xsup)[(Glu->supno)[jcol]];
    nsupc      = jcol - fsupc;	        /* excluding jcol; nsupc >= 0 */
    lptr       = xlsub[fsupc];
    nsupr      = xlsub[fsupc+1] - lptr;
    lu_sup_ptr = &lusup[xlusup[fsupc]];	/* start of the current supernode */
    lu_col_ptr = &lusup[xlusup[jcol]];	/* start of jcol in the supernode */
    lsub_ptr   = &lsub[lptr];	/* start of row indices of the supernode */

#ifdef DEBUG
if ( jcol == MIN_COL ) {
    printf("Before cdiv: col %d\n", jcol);
    for (k = nsupc; k < nsupr; k++) 
	printf("  lu[%d] %f\n", lsub_ptr[k], lu_col_ptr[k]);
}
#endif
    
    /* Determine the largest abs numerical value for partial pivoting;
       Also search for user-specified pivot, and diagonal element. */
    if ( *usepr ) *pivrow = iperm_r[jcol];
    diagind = iperm_c[jcol];
    pivmax = 0.0;
    pivptr = nsupc;
    diag = SLU_EMPTY;
    old_pivptr = nsupc;
    for (isub = nsupc; isub < nsupr; ++isub) {
        rtemp = c_abs1 (&lu_col_ptr[isub]);
	if ( rtemp > pivmax ) {
	    pivmax = rtemp;
	    pivptr = isub;
	}
	if ( *usepr && lsub_ptr[isub] == *pivrow ) old_pivptr = isub;
	if ( lsub_ptr[isub] == diagind ) diag = isub;
    }

    /* Test for singularity */
    if ( pivmax == 0.0 ) {
#if 0
        // There is no valid pivot.
        // jcol represents the rank of U, 
        // report the rank, let dgstrf handle the pivot
	*pivrow = lsub_ptr[pivptr];
	perm_r[*pivrow] = jcol;
#endif
	*usepr = 0;
	return (jcol+1);
    }

    thresh = u * pivmax;
    
    /* Choose appropriate pivotal element by our policy. */
    if ( *usepr ) {
        rtemp = c_abs1 (&lu_col_ptr[old_pivptr]);
	if ( rtemp != 0.0 && rtemp >= thresh )
	    pivptr = old_pivptr;
	else
	    *usepr = 0;
    }
    if ( *usepr == 0 ) {
	/* Use diagonal pivot? */
	if ( diag >= 0 ) { /* diagonal exists */
            rtemp = c_abs1 (&lu_col_ptr[diag]);
	    if ( rtemp != 0.0 && rtemp >= thresh ) pivptr = diag;
        }
	*pivrow = lsub_ptr[pivptr];
    }
    
    /* Record pivot row */
    perm_r[*pivrow] = jcol;
    
    /* Interchange row subscripts */
    if ( pivptr != nsupc ) {
	itemp = lsub_ptr[pivptr];
	lsub_ptr[pivptr] = lsub_ptr[nsupc];
	lsub_ptr[nsupc] = itemp;

	/* Interchange numerical values as well, for the whole snode, such 
	 * that L is indexed the same way as A.
 	 */
	for (icol = 0; icol <= nsupc; icol++) {
	    itemp = pivptr + icol * nsupr;
	    temp = lu_sup_ptr[itemp];
	    lu_sup_ptr[itemp] = lu_sup_ptr[nsupc + icol*nsupr];
	    lu_sup_ptr[nsupc + icol*nsupr] = temp;
	}
    } /* if */

    /* cdiv operation */
    ops[FACT] += 10 * (nsupr - nsupc);

    c_div(&temp, &one, &lu_col_ptr[nsupc]);
    for (k = nsupc+1; k < nsupr; k++) 
	cc_mult(&lu_col_ptr[k], &lu_col_ptr[k], &temp);

    return 0;
}